

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::setBlockFormat
          (QTextDocumentPrivate *this,QTextBlock *from,QTextBlock *to,QTextBlockFormat *newFormat,
          FormatChangeMode mode)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTextDocumentPrivate *this_00;
  QTextBlockData *pQVar4;
  QTextDocumentPrivate *this_01;
  QTextFormat *in_RCX;
  QTextFormat *in_RDX;
  QTextBlock *in_RSI;
  QTextDocumentPrivate *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QTextBlockGroup *oldGroup;
  int oldFormat;
  QTextBlockGroup *group;
  int newFormatIdx;
  QTextUndoCommand c;
  QTextBlockFormat format;
  QTextBlock end;
  QTextBlock it;
  QTextFormat *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff3c;
  QTextBlock *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QTextFormatCollection *in_stack_ffffffffffffff58;
  int from_00;
  int local_a0;
  QTextBlock local_58;
  undefined1 *local_48;
  undefined1 *local_40;
  QTextBlock local_38;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  beginEditBlock(in_RDI);
  local_a0 = -1;
  if (in_R8D == 1) {
    local_a0 = QTextFormatCollection::indexForFormat
                         (in_stack_ffffffffffffff58,
                          (QTextFormat *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  objectForFormat((QTextDocumentPrivate *)
                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff28);
  this_00 = (QTextDocumentPrivate *)qobject_cast<QTextBlockGroup*>((QObject *)0x7d4664);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::QTextBlock((QTextBlock *)local_18,in_RSI);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::QTextBlock((QTextBlock *)local_28,(QTextBlock *)in_RDX);
  bVar1 = QTextBlock::isValid((QTextBlock *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (bVar1) {
    QTextBlock::next(in_stack_ffffffffffffff48);
    QTextBlock::operator=((QTextBlock *)local_28,&local_38);
  }
  while (bVar1 = QTextBlock::operator!=((QTextBlock *)local_18,(QTextBlock *)local_28), bVar1) {
    pQVar4 = block((QTextBlock *)0x7d4733);
    iVar2 = pQVar4->format;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormatCollection::blockFormat((QTextFormatCollection *)in_RDI,in_stack_ffffffffffffff3c);
    objectForFormat((QTextDocumentPrivate *)
                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff28);
    this_01 = (QTextDocumentPrivate *)qobject_cast<QTextBlockGroup*>((QObject *)0x7d478f);
    if (in_R8D == 0) {
      QTextFormat::merge(in_RDX,in_RCX);
      local_a0 = QTextFormatCollection::indexForFormat
                           ((QTextFormatCollection *)this_00,
                            (QTextFormat *)CONCAT44(iVar2,in_stack_ffffffffffffff50));
      objectForFormat((QTextDocumentPrivate *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff28);
      this_00 = (QTextDocumentPrivate *)qobject_cast<QTextBlockGroup*>((QObject *)0x7d47e4);
    }
    in_stack_ffffffffffffff3c = local_a0;
    pQVar4 = block((QTextBlock *)0x7d47fe);
    pQVar4->format = in_stack_ffffffffffffff3c;
    block((QTextBlock *)0x7d4812);
    QTextBlockData::invalidate
              ((QTextBlockData *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    QTextBlock::position((QTextBlock *)in_stack_ffffffffffffff28);
    appendUndoItem(this_01,(QTextUndoCommand *)in_RDI);
    if (this_00 == this_01) {
      if (this_00 != (QTextDocumentPrivate *)0x0) {
        (**(code **)(*(long *)this_00 + 0x70))(this_00,local_18);
      }
    }
    else {
      if (this_01 != (QTextDocumentPrivate *)0x0) {
        (**(code **)(*(long *)this_01 + 0x68))(this_01,local_18);
      }
      if (this_00 != (QTextDocumentPrivate *)0x0) {
        (**(code **)(*(long *)this_00 + 0x60))(this_00,local_18);
      }
    }
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7d4928);
    QTextBlock::next((QTextBlock *)this_01);
    QTextBlock::operator=((QTextBlock *)local_18,&local_58);
  }
  QTextBlock::position((QTextBlock *)in_stack_ffffffffffffff28);
  from_00 = (int)((ulong)this_00 >> 0x20);
  iVar2 = QTextBlock::position((QTextBlock *)in_stack_ffffffffffffff28);
  iVar3 = QTextBlock::length((QTextBlock *)in_stack_ffffffffffffff28);
  iVar3 = iVar2 + iVar3;
  QTextBlock::position((QTextBlock *)in_stack_ffffffffffffff28);
  documentChange(in_RDI,from_00,in_stack_ffffffffffffff3c);
  endEditBlock((QTextDocumentPrivate *)CONCAT44(iVar3,iVar2));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::setBlockFormat(const QTextBlock &from, const QTextBlock &to,
                                          const QTextBlockFormat &newFormat, FormatChangeMode mode)
{
    beginEditBlock();

    Q_ASSERT(mode != SetFormatAndPreserveObjectIndices); // only implemented for setCharFormat

    Q_ASSERT(newFormat.isValid());

    int newFormatIdx = -1;
    if (mode == SetFormat)
        newFormatIdx = formats.indexForFormat(newFormat);
    QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(newFormat));

    QTextBlock it = from;
    QTextBlock end = to;
    if (end.isValid())
        end = end.next();

    for (; it != end; it = it.next()) {
        int oldFormat = block(it)->format;
        QTextBlockFormat format = formats.blockFormat(oldFormat);
        QTextBlockGroup *oldGroup = qobject_cast<QTextBlockGroup *>(objectForFormat(format));
        if (mode == MergeFormat) {
            format.merge(newFormat);
            newFormatIdx = formats.indexForFormat(format);
            group = qobject_cast<QTextBlockGroup *>(objectForFormat(format));
        }
        block(it)->format = newFormatIdx;

        block(it)->invalidate();

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::BlockFormatChanged, true, QTextUndoCommand::MoveCursor, oldFormat,
                                0, it.position(), 1, 0);
        appendUndoItem(c);

        if (group != oldGroup) {
            if (oldGroup)
                oldGroup->blockRemoved(it);
            if (group)
                group->blockInserted(it);
        } else if (group) {
            group->blockFormatChanged(it);
        }
    }

    documentChange(from.position(), to.position() + to.length() - from.position());

    endEditBlock();
}